

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O3

void __thiscall
Js::AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
          (AsmJsFunctionDeclaration *this,PropertyName name,SymbolType type,
          ArenaAllocator *allocator)

{
  SymbolType SVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  (this->super_AsmJsSymbol).mName = name;
  (this->super_AsmJsSymbol).mType = type;
  (this->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014e8e28;
  AsmJsRetType::AsmJsRetType((AsmJsRetType *)&(this->super_AsmJsSymbol).field_0x14,Void);
  this->mArgCount = 0xffff;
  this->mLocation = 0;
  this->mArgumentsType = (AsmJsType *)0x0;
  this->field_0x28 = this->field_0x28 & 0xfe;
  this->mAllocator = allocator;
  SVar1 = (this->super_AsmJsSymbol).mType;
  if ((ClosureFunction < SVar1) || ((0xb70U >> (SVar1 & 0x1f) & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1cb,"(AsmJsFunctionDeclaration::Is(this))",
                                "AsmJsFunctionDeclaration::Is(this)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

AsmJsFunctionDeclaration::AsmJsFunctionDeclaration(PropertyName name, AsmJsSymbol::SymbolType type, ArenaAllocator* allocator) :
        AsmJsSymbol(name, type)
        , mAllocator(allocator)
        , mReturnType(AsmJsRetType::Void)
        , mArgCount(Constants::InvalidArgSlot)
        , mLocation(0)
        , mReturnTypeKnown(false)
        , mArgumentsType(nullptr)
    {
        Assert(AsmJsFunctionDeclaration::Is(this));
    }